

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductBase.h
# Opt level: O1

void __thiscall
Eigen::
ProductBase<Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5>,_Eigen::GeneralProduct<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
::ProductBase(ProductBase<Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
              *this,GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>
                    *a_lhs,Matrix<double,__1,__1,_0,__1,__1> *a_rhs)

{
  PlainObject *pPVar1;
  
  pPVar1 = Eigen::ProductBase::operator_cast_to_Matrix_((ProductBase *)a_lhs);
  this->m_lhs = pPVar1;
  this->m_rhs = a_rhs;
  (this->m_result).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       = (double *)0x0;
  (this->m_result).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
       = 0;
  (this->m_result).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
       = 0;
  if ((((a_lhs->
        super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
        ).m_rhs)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
      == (a_rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows)
  {
    return;
  }
  __assert_fail("a_lhs.cols() == a_rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/preritj[P]Extended-Kalman-Filter/src/Eigen/src/Core/ProductBase.h"
                ,0x66,
                "Eigen::ProductBase<Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>, 5>, Eigen::Matrix<double, -1, -1>, 5>, Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>, 5>, Eigen::Matrix<double, -1, -1>>::ProductBase(const Lhs &, const Rhs &) [Derived = Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>, 5>, Eigen::Matrix<double, -1, -1>, 5>, Lhs = Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>, 5>, Rhs = Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

ProductBase(const Lhs& a_lhs, const Rhs& a_rhs)
      : m_lhs(a_lhs), m_rhs(a_rhs)
    {
      eigen_assert(a_lhs.cols() == a_rhs.rows()
        && "invalid matrix product"
        && "if you wanted a coeff-wise or a dot product use the respective explicit functions");
    }